

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::SRGBDecodeTests::init(SRGBDecodeTests *this,EVP_PKEY_CTX *ctx)

{
  TextureFormat internalFormat;
  bool bVar1;
  int extraout_EAX;
  TestNode *node;
  SRGBTestCase *pSVar2;
  bool bVar3;
  char **ppcVar4;
  TestGroupConfig testGroupConfigList [2];
  char *local_68;
  char *local_60;
  undefined8 local_58;
  char *local_50;
  char *local_48;
  undefined8 local_40;
  
  local_68 = "srgba8";
  local_60 = "srgb decode tests using srgba internal format";
  local_58 = 0x30000000f;
  local_50 = "sr8";
  local_48 = "srgb decode tests using sr8 internal format";
  local_40 = 0x30000000c;
  ppcVar4 = &local_68;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,*ppcVar4,
               ppcVar4[1]);
    tcu::TestNode::addChild((TestNode *)this,node);
    pSVar2 = (SRGBTestCase *)operator_new(0x158);
    internalFormat = *(TextureFormat *)(ppcVar4 + 2);
    Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"skipped",
               "testing for sRGB color values with sRGB texture decoding skipped",internalFormat);
    (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_021633a0;
    tcu::TestNode::addChild(node,(TestNode *)pSVar2);
    pSVar2 = (SRGBTestCase *)operator_new(0x158);
    Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"enabled",
               "testing for linear color values with sRGB texture decoding enabled",internalFormat);
    (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_02163470;
    tcu::TestNode::addChild(node,(TestNode *)pSVar2);
    pSVar2 = (SRGBTestCase *)operator_new(0x158);
    Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"texel_fetch",
               "testing for linear color values with sRGB texture decoding skipped",internalFormat);
    (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_021634d8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar2);
    pSVar2 = (SRGBTestCase *)operator_new(0x158);
    Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"conversion_gpu",
               "sampling linear values and performing conversion on the gpu",internalFormat);
    (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_02163540;
    tcu::TestNode::addChild(node,(TestNode *)pSVar2);
    pSVar2 = (SRGBTestCase *)operator_new(0x158);
    Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"toggled",
               "toggle the sRGB decoding between draw calls",internalFormat);
    (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_021635a8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar2);
    pSVar2 = (SRGBTestCase *)operator_new(0x158);
    Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"multiple_textures",
               "upload multiple textures with different sRGB decode values and sample",
               internalFormat);
    (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_02163610;
    tcu::TestNode::addChild(node,(TestNode *)pSVar2);
    pSVar2 = (SRGBTestCase *)operator_new(0x158);
    Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"using_sampler",
               "testing that sampler object takes priority over texture state",internalFormat);
    (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_02163678;
    tcu::TestNode::addChild(node,(TestNode *)pSVar2);
    ppcVar4 = &local_50;
    bVar1 = false;
  } while (bVar3);
  return extraout_EAX;
}

Assistant:

void SRGBDecodeTests::init (void)
{
	const TestGroupConfig testGroupConfigList[] =
	{
		TestGroupConfig("srgba8",	"srgb decode tests using srgba internal format",	tcu::TextureFormat(tcu::TextureFormat::sRGBA, tcu::TextureFormat::UNORM_INT8)),
		TestGroupConfig("sr8",		"srgb decode tests using sr8 internal format",		tcu::TextureFormat(tcu::TextureFormat::sR, tcu::TextureFormat::UNORM_INT8))
	};

	// create groups for all desired internal formats, adding test cases to each
	for (std::size_t idx = 0; idx < DE_LENGTH_OF_ARRAY(testGroupConfigList); idx++)
	{
		tcu::TestCaseGroup* const testGroup = new tcu::TestCaseGroup(m_testCtx, testGroupConfigList[idx].name, testGroupConfigList[idx].description);
		tcu::TestNode::addChild(testGroup);

		testGroup->addChild(new TextureDecodeSkippedCase		(m_context, "skipped",			"testing for sRGB color values with sRGB texture decoding skipped",		testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new TextureDecodeEnabledCase		(m_context, "enabled",			"testing for linear color values with sRGB texture decoding enabled",	testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new TexelFetchDecodeSkippedcase		(m_context, "texel_fetch",		"testing for linear color values with sRGB texture decoding skipped",	testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new GPUConversionDecodeEnabledCase	(m_context, "conversion_gpu",	"sampling linear values and performing conversion on the gpu",			testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new DecodeToggledCase				(m_context, "toggled",			"toggle the sRGB decoding between draw calls",							testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new DecodeMultipleTexturesCase		(m_context, "multiple_textures","upload multiple textures with different sRGB decode values and sample",testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new DecodeSamplerCase				(m_context, "using_sampler",	"testing that sampler object takes priority over texture state",		testGroupConfigList[idx].internalFormat));
	}
}